

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O1

void chebyshev1_set(int n,double *x,double *w)

{
  ostream *poVar1;
  
  switch(n) {
  case 1:
    *x = 0.0;
    *w = 3.141592653589793;
    break;
  case 2:
    *x = -0.7071067811865475;
    x[1] = 0.7071067811865476;
    *w = 1.570796326794897;
    w[1] = 1.570796326794897;
    break;
  case 3:
    *x = -0.8660254037844387;
    x[1] = 0.0;
    x[2] = 0.8660254037844387;
    *w = 1.047197551196598;
    w[1] = 1.047197551196598;
    w[2] = 1.047197551196598;
    break;
  case 4:
    *x = -0.9238795325112867;
    x[1] = -0.3826834323650897;
    x[2] = 0.3826834323650898;
    x[3] = 0.9238795325112867;
    *w = 0.7853981633974483;
    w[1] = 0.7853981633974483;
    w[2] = 0.7853981633974483;
    w[3] = 0.7853981633974483;
    break;
  case 5:
    *x = -0.9510565162951535;
    x[1] = -0.587785252292473;
    x[2] = 0.0;
    x[3] = 0.5877852522924731;
    x[4] = 0.9510565162951535;
    *w = 0.6283185307179586;
    w[1] = 0.6283185307179586;
    w[2] = 0.6283185307179586;
    w[3] = 0.6283185307179586;
    w[4] = 0.6283185307179586;
    break;
  case 6:
    *x = -0.9659258262890682;
    x[1] = -0.7071067811865475;
    x[2] = -0.2588190451025206;
    x[3] = 0.2588190451025207;
    x[4] = 0.7071067811865476;
    x[5] = 0.9659258262890683;
    *w = 0.5235987755982988;
    w[1] = 0.5235987755982988;
    w[2] = 0.5235987755982988;
    w[3] = 0.5235987755982988;
    w[4] = 0.5235987755982988;
    w[5] = 0.5235987755982988;
    break;
  case 7:
    *x = -0.9749279121818237;
    x[1] = -0.7818314824680295;
    x[2] = -0.4338837391175581;
    x[3] = 0.0;
    x[4] = 0.4338837391175582;
    x[5] = 0.7818314824680298;
    x[6] = 0.9749279121818236;
    *w = 0.4487989505128276;
    w[1] = 0.4487989505128276;
    w[2] = 0.4487989505128276;
    w[3] = 0.4487989505128276;
    w[4] = 0.4487989505128276;
    w[5] = 0.4487989505128276;
    w[6] = 0.4487989505128276;
    break;
  case 8:
    *x = -0.9807852804032304;
    x[1] = -0.8314696123025453;
    x[2] = -0.555570233019602;
    x[3] = -0.1950903220161282;
    x[4] = 0.1950903220161283;
    x[5] = 0.5555702330196023;
    x[6] = 0.8314696123025452;
    x[7] = 0.9807852804032304;
    *w = 0.3926990816987241;
    w[1] = 0.3926990816987241;
    w[2] = 0.3926990816987241;
    w[3] = 0.3926990816987241;
    w[4] = 0.3926990816987241;
    w[5] = 0.3926990816987241;
    w[6] = 0.3926990816987241;
    w[7] = 0.3926990816987241;
    break;
  case 9:
    *x = -0.984807753012208;
    x[1] = -0.8660254037844385;
    x[2] = -0.6427876096865394;
    x[3] = -0.3420201433256685;
    x[4] = 0.0;
    x[5] = 0.3420201433256688;
    x[6] = 0.6427876096865394;
    x[7] = 0.8660254037844387;
    x[8] = 0.984807753012208;
    *w = 0.3490658503988659;
    w[1] = 0.3490658503988659;
    w[2] = 0.3490658503988659;
    w[3] = 0.3490658503988659;
    w[4] = 0.3490658503988659;
    w[5] = 0.3490658503988659;
    w[6] = 0.3490658503988659;
    w[7] = 0.3490658503988659;
    w[8] = 0.3490658503988659;
    break;
  case 10:
    *x = -0.9876883405951377;
    x[1] = -0.8910065241883678;
    x[2] = -0.7071067811865475;
    x[3] = -0.4539904997395467;
    x[4] = -0.1564344650402306;
    x[5] = 0.1564344650402309;
    x[6] = 0.4539904997395468;
    x[7] = 0.7071067811865476;
    x[8] = 0.8910065241883679;
    x[9] = 0.9876883405951378;
    *w = 0.3141592653589793;
    w[1] = 0.3141592653589793;
    w[2] = 0.3141592653589793;
    w[3] = 0.3141592653589793;
    w[4] = 0.3141592653589793;
    w[5] = 0.3141592653589793;
    w[6] = 0.3141592653589793;
    w[7] = 0.3141592653589793;
    w[8] = 0.3141592653589793;
    w[9] = 0.3141592653589793;
    break;
  default:
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"CHEBYSHEV1_SET - Fatal error!\n");
    poVar1 = std::operator<<((ostream *)&std::cerr,"  Illegal value of N = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,n);
    std::operator<<(poVar1,"\n");
    std::operator<<((ostream *)&std::cerr,"  Legal values are 1 through 10.\n");
    exit(1);
  }
  return;
}

Assistant:

void chebyshev1_set ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    CHEBYSHEV1_SET sets a Chebyshev Type 1 quadrature rule.
//
//  Discussion:
//
//    The integral:
//
//      integral ( -1 <= x <= 1 ) f(x) / sqrt ( 1 - x * x ) dx
//
//    The quadrature rule:
//
//      sum ( 1 <= i <= n ) w(i) * f ( x(i) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    27 May 2014
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the order.
//    N must be between 1 and 10.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  if ( n == 1 )
  {
    x[0] =   0.0;
    w[0] =    3.141592653589793;
  }
  else if ( n == 2 )
  {
    x[0] =  -0.7071067811865475;
    x[1] =   0.7071067811865476;
    w[0] =    1.570796326794897;
    w[1] =    1.570796326794897;
  }
  else if ( n == 3 )
  {  
    x[0] =  -0.8660254037844387;
    x[1] =   0.0;
    x[2] =   0.8660254037844387;
    w[0] =    1.047197551196598;
    w[1] =    1.047197551196598;
    w[2] =    1.047197551196598;
  }
  else if ( n == 4 )
  {
    x[0] =  -0.9238795325112867;    
    x[1] =  -0.3826834323650897;    
    x[2] =   0.3826834323650898;    
    x[3] =   0.9238795325112867;    
    w[0] =   0.7853981633974483;    
    w[1] =   0.7853981633974483;    
    w[2] =   0.7853981633974483;
    w[3] =   0.7853981633974483;
  }
  else if ( n == 5 )
  {
    x[0] =  -0.9510565162951535;    
    x[1] =  -0.5877852522924730;
    x[2] =   0.0;
    x[3] =   0.5877852522924731;    
    x[4] =   0.9510565162951535;    
    w[0] =   0.6283185307179586;    
    w[1] =   0.6283185307179586;    
    w[2] =   0.6283185307179586;    
    w[3] =   0.6283185307179586;    
    w[4] =   0.6283185307179586;
  }
  else if ( n == 6 )
  {
    x[0] =  -0.9659258262890682;    
    x[1] =  -0.7071067811865475;    
    x[2] =  -0.2588190451025206;    
    x[3] =   0.2588190451025207;    
    x[4] =   0.7071067811865476;    
    x[5] =   0.9659258262890683;    
    w[0] =   0.5235987755982988;    
    w[1] =   0.5235987755982988;    
    w[2] =   0.5235987755982988;    
    w[3] =   0.5235987755982988;    
    w[4] =   0.5235987755982988;    
    w[5] =   0.5235987755982988;
  }
  else if ( n == 7 )
  {
    x[0] =  -0.9749279121818237;    
    x[1] =  -0.7818314824680295;    
    x[2] =  -0.4338837391175581;    
    x[3] =   0.0;
    x[4] =   0.4338837391175582;    
    x[5] =   0.7818314824680298;    
    x[6] =   0.9749279121818236;    
    w[0] =   0.4487989505128276;    
    w[1] =   0.4487989505128276;    
    w[2] =   0.4487989505128276;    
    w[3] =   0.4487989505128276;    
    w[4] =   0.4487989505128276;    
    w[5] =   0.4487989505128276;    
    w[6] =   0.4487989505128276;
  }
  else if ( n == 8 )
  {
    x[0] =  -0.9807852804032304;    
    x[1] =  -0.8314696123025453;    
    x[2] =  -0.5555702330196020;    
    x[3] =  -0.1950903220161282;    
    x[4] =   0.1950903220161283;    
    x[5] =   0.5555702330196023;    
    x[6] =   0.8314696123025452;    
    x[7] =   0.9807852804032304;    
    w[0] =   0.3926990816987241;    
    w[1] =   0.3926990816987241;    
    w[2] =   0.3926990816987241;    
    w[3] =   0.3926990816987241;    
    w[4] =   0.3926990816987241;    
    w[5] =   0.3926990816987241;    
    w[6] =   0.3926990816987241;    
    w[7] =   0.3926990816987241;
  }
  else if ( n == 9 )
  {
    x[0] =  -0.9848077530122080;    
    x[1] =  -0.8660254037844385;    
    x[2] =  -0.6427876096865394;    
    x[3] =  -0.3420201433256685;
    x[4] =   0.0;
    x[5] =   0.3420201433256688;    
    x[6] =   0.6427876096865394;    
    x[7] =   0.8660254037844387;    
    x[8] =   0.9848077530122080;
    w[0] =   0.3490658503988659;    
    w[1] =   0.3490658503988659;    
    w[2] =   0.3490658503988659;    
    w[3] =   0.3490658503988659;    
    w[4] =   0.3490658503988659;    
    w[5] =   0.3490658503988659;    
    w[6] =   0.3490658503988659;    
    w[7] =   0.3490658503988659;    
    w[8] =   0.3490658503988659; 
  }
  else if ( n == 10 )
  {
    x[0] =  -0.9876883405951377;    
    x[1] =  -0.8910065241883678;    
    x[2] =  -0.7071067811865475;    
    x[3] =  -0.4539904997395467;    
    x[4] =  -0.1564344650402306;    
    x[5] =   0.1564344650402309;    
    x[6] =   0.4539904997395468;    
    x[7] =   0.7071067811865476;    
    x[8] =   0.8910065241883679;    
    x[9] =   0.9876883405951378;    
    w[0] =   0.3141592653589793;    
    w[1] =   0.3141592653589793;    
    w[2] =   0.3141592653589793;    
    w[3] =   0.3141592653589793;    
    w[4] =   0.3141592653589793;    
    w[5] =   0.3141592653589793;    
    w[6] =   0.3141592653589793;    
    w[7] =   0.3141592653589793;    
    w[8] =   0.3141592653589793;
    w[9] =   0.3141592653589793;
  }
  else
  {
    std::cerr << "\n";
    std::cerr << "CHEBYSHEV1_SET - Fatal error!\n";
    std::cerr << "  Illegal value of N = " << n << "\n";
    std::cerr << "  Legal values are 1 through 10.\n";
    exit ( 1 );
  }

  return;
}